

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O1

void __thiscall
icu_63::TransliteratorSpec::TransliteratorSpec(TransliteratorSpec *this,UnicodeString *theSpec)

{
  UnicodeString *this_00;
  short sVar1;
  int32_t iVar2;
  int iVar3;
  CharString *pCVar4;
  char *src;
  ResourceBundle *this_01;
  Locale *result;
  UErrorCode status;
  UnicodeString locStr;
  UScriptCode script [10];
  Locale topLoc;
  UErrorCode local_184;
  UnicodeString *local_180;
  CharString local_178;
  UScriptCode local_138 [10];
  Locale local_110;
  
  this_00 = &this->top;
  icu_63::UnicodeString::UnicodeString(this_00,theSpec);
  (this->spec).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0048be70;
  (this->spec).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->nextSpec).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0048be70;
  (this->nextSpec).fUnion.fStackFields.fLengthAndFlags = 2;
  local_180 = &this->scriptName;
  (this->scriptName).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0048be70;
  (this->scriptName).fUnion.fStackFields.fLengthAndFlags = 2;
  this->res = (ResourceBundle *)0x0;
  local_184 = U_ZERO_ERROR;
  Locale::Locale(&local_110,"",(char *)0x0,(char *)0x0,(char *)0x0);
  result = &local_110;
  LocaleUtility::initLocaleFromName(theSpec,result);
  if (local_110.fIsBogus == '\0') {
    this_01 = (ResourceBundle *)UMemory::operator_new((UMemory *)0x18,(size_t)result);
    if (this_01 == (ResourceBundle *)0x0) {
      this_01 = (ResourceBundle *)0x0;
    }
    else {
      ResourceBundle::ResourceBundle(this_01,"icudt63l-translit",&local_110,&local_184);
    }
    this->res = this_01;
    if (this_01 == (ResourceBundle *)0x0) goto LAB_002788ed;
    if (U_ZERO_ERROR < local_184 || local_184 == U_USING_DEFAULT_WARNING) {
      (*(this_01->super_UObject)._vptr_UObject[1])(this_01);
      this->res = (ResourceBundle *)0x0;
    }
  }
  local_184 = U_ZERO_ERROR;
  local_138[2] = USCRIPT_COMMON;
  local_138[3] = USCRIPT_COMMON;
  local_138[4] = USCRIPT_COMMON;
  local_138[5] = USCRIPT_COMMON;
  local_138[6] = USCRIPT_COMMON;
  local_138[7] = USCRIPT_COMMON;
  local_138[8] = USCRIPT_COMMON;
  local_138[9] = USCRIPT_COMMON;
  local_138[0] = USCRIPT_INVALID_CODE;
  local_138[1] = USCRIPT_COMMON;
  MaybeStackArray<char,_40>::MaybeStackArray(&local_178.buffer);
  local_178.len = 0;
  *local_178.buffer.ptr = 0;
  pCVar4 = CharString::appendInvariantChars(&local_178,theSpec,&local_184);
  iVar2 = uscript_getCode_63((pCVar4->buffer).ptr,local_138,10,&local_184);
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_178.buffer);
  if (local_138[0] != USCRIPT_INVALID_CODE && 0 < iVar2) {
    src = uscript_getName_63(local_138[0]);
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_178,src,-1,kInvariant);
    icu_63::UnicodeString::moveFrom(local_180,(UnicodeString *)&local_178);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_178);
  }
  if (this->res == (ResourceBundle *)0x0) {
    sVar1 = (this->scriptName).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (this->scriptName).fUnion.fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    if (iVar3 != 0) {
      icu_63::UnicodeString::operator=(this_00,local_180);
    }
  }
  else {
    local_178.buffer.ptr = (char *)&PTR__UnicodeString_0048be70;
    local_178.buffer.capacity._0_2_ = 2;
    LocaleUtility::initNameFromLocale(&local_110,(UnicodeString *)&local_178);
    if (((ushort)local_178.buffer.capacity & 1) == 0) {
      icu_63::UnicodeString::operator=(this_00,(UnicodeString *)&local_178);
    }
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_178);
  }
  reset(this);
LAB_002788ed:
  Locale::~Locale(&local_110);
  return;
}

Assistant:

TransliteratorSpec::TransliteratorSpec(const UnicodeString& theSpec)
: top(theSpec),
  res(0)
{
    UErrorCode status = U_ZERO_ERROR;
    Locale topLoc("");
    LocaleUtility::initLocaleFromName(theSpec, topLoc);
    if (!topLoc.isBogus()) {
        res = new ResourceBundle(U_ICUDATA_TRANSLIT, topLoc, status);
        /* test for NULL */
        if (res == 0) {
            return;
        }
        if (U_FAILURE(status) || status == U_USING_DEFAULT_WARNING) {
            delete res;
            res = 0;
        }
    }

    // Canonicalize script name -or- do locale->script mapping
    status = U_ZERO_ERROR;
    static const int32_t capacity = 10;
    UScriptCode script[capacity]={USCRIPT_INVALID_CODE};
    int32_t num = uscript_getCode(CharString().appendInvariantChars(theSpec, status).data(),
                                  script, capacity, &status);
    if (num > 0 && script[0] != USCRIPT_INVALID_CODE) {
        scriptName = UnicodeString(uscript_getName(script[0]), -1, US_INV);
    }

    // Canonicalize top
    if (res != 0) {
        // Canonicalize locale name
        UnicodeString locStr;
        LocaleUtility::initNameFromLocale(topLoc, locStr);
        if (!locStr.isBogus()) {
            top = locStr;
        }
    } else if (scriptName.length() != 0) {
        // We are a script; use canonical name
        top = scriptName;
    }

    // assert(spec != top);
    reset();
}